

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_s_Test::TestBody(PhPacker_Arg_s_Test *this)

{
  short sVar1;
  short *psVar2;
  char *pcVar3;
  int16_t result;
  int16_t expected;
  string str;
  int16_t res;
  string s;
  short local_92;
  AssertHelper local_90;
  undefined1 local_88 [8];
  _Storage local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  AssertHelper local_68;
  short local_5a;
  undefined1 local_58 [8];
  _Storage local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  short local_32;
  string local_30;
  
  PhPacker::pack<short,_0>(&local_30,'s',0x7b);
  PhPacker::unpack((PhPacker *)local_58,'s',&local_30);
  psVar2 = (short *)std::__any_caster<short>((any *)local_58);
  if (psVar2 == (short *)0x0) {
    std::__throw_bad_any_cast();
  }
  sVar1 = *psVar2;
  if ((code *)CONCAT71(local_58._1_7_,local_58[0]) != (code *)0x0) {
    (*(code *)CONCAT71(local_58._1_7_,local_58[0]))(3,local_58,0);
  }
  local_88._0_4_ = 0x7b;
  local_32 = sVar1;
  testing::internal::CmpHelperEQ<short,int>
            ((internal *)local_58,"res","123",&local_32,(int *)local_88);
  if (local_58[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_50._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_88._4_4_,local_88._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88._4_4_,local_88._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50._M_ptr);
  }
  PhPacker::pack<short,_0>((string *)local_58,'s',0x28f);
  PhPacker::unpack((PhPacker *)local_88,'s',(string *)local_58);
  psVar2 = (short *)std::__any_caster<short>((any *)local_88);
  if (psVar2 == (short *)0x0) {
    std::__throw_bad_any_cast();
  }
  sVar1 = *psVar2;
  if ((code *)CONCAT44(local_88._4_4_,local_88._0_4_) != (code *)0x0) {
    (*(code *)CONCAT44(local_88._4_4_,local_88._0_4_))(3,local_88,0);
  }
  local_5a = 0x28f;
  local_92 = sVar1;
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)local_88,"result","expected",&local_92,&local_5a);
  if (local_88[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_80._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_80._M_ptr);
    }
    PhPacker::pack<short,_0>((string *)local_88,'s',0x7fff);
    std::__cxx11::string::operator=((string *)local_58,(string *)local_88);
    if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),
                      local_78._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_88,'s',(string *)local_58);
    psVar2 = (short *)std::__any_caster<short>((any *)local_88);
    if (psVar2 == (short *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_92 = *psVar2;
    if ((code *)CONCAT44(local_88._4_4_,local_88._0_4_) != (code *)0x0) {
      (*(code *)CONCAT44(local_88._4_4_,local_88._0_4_))(3,local_88,0);
    }
    local_5a = 0x7fff;
    testing::internal::CmpHelperEQ<short,short>
              ((internal *)local_88,"result","expected",&local_92,&local_5a);
    if (local_88[0] == (PhPacker)0x0) {
      testing::Message::Message((Message *)&local_90);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *local_80._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x28,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_88 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_80._M_ptr);
      }
      PhPacker::pack<short,_0>((string *)local_88,'s',-0x8000);
      std::__cxx11::string::operator=((string *)local_58,(string *)local_88);
      if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),
                        local_78._M_allocated_capacity + 1);
      }
      PhPacker::unpack((PhPacker *)local_88,'s',(string *)local_58);
      psVar2 = (short *)std::__any_caster<short>((any *)local_88);
      if (psVar2 == (short *)0x0) {
        std::__throw_bad_any_cast();
      }
      local_92 = *psVar2;
      if ((code *)CONCAT44(local_88._4_4_,local_88._0_4_) != (code *)0x0) {
        (*(code *)CONCAT44(local_88._4_4_,local_88._0_4_))(3,local_88,0);
      }
      local_5a = -0x8000;
      testing::internal::CmpHelperEQ<short,short>
                ((internal *)local_88,"result","expected",&local_92,&local_5a);
      if (local_88[0] != (PhPacker)0x0) goto LAB_0010c245;
      testing::Message::Message((Message *)&local_90);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *local_80._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x2d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_90.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_90.data_ + 8))();
  }
LAB_0010c245:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_80._M_ptr);
  }
  if ((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]) != local_58 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]),
                    local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_s)
{
    int16_t val = 123;
    auto s = PhPacker::pack<short>('s', val);
    int16_t res = std::any_cast<short>(PhPacker::unpack('s', s));
    EXPECT_EQ(res, 123);

    std::string str = PhPacker::pack<short>('s', int16_t{655});
    int16_t result = std::any_cast<short>(PhPacker::unpack('s', str));
    int16_t expected = 655;
    GTEST_ASSERT_EQ(result, expected);

    str = PhPacker::pack<int16_t>('s', std::numeric_limits<int16_t>::max());
    result = std::any_cast<int16_t>(PhPacker::unpack('s', str));
    expected = std::numeric_limits<int16_t>::max();
    GTEST_ASSERT_EQ(result, expected);

    str = PhPacker::pack<int16_t>('s', std::numeric_limits<int16_t>::min());
    result = std::any_cast<int16_t>(PhPacker::unpack('s', str));
    expected = std::numeric_limits<int16_t>::min();
    GTEST_ASSERT_EQ(result, expected);
}